

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

xmlAutomataStatePtr
xmlAutomataNewCountedTrans
          (xmlAutomataPtr am,xmlAutomataStatePtr from,xmlAutomataStatePtr to,int counter)

{
  int counter_local;
  xmlAutomataStatePtr to_local;
  xmlAutomataStatePtr from_local;
  xmlAutomataPtr am_local;
  
  if (((am == (xmlAutomataPtr)0x0) || (from == (xmlAutomataStatePtr)0x0)) || (counter < 0)) {
    am_local = (xmlAutomataPtr)0x0;
  }
  else {
    xmlFAGenerateCountedEpsilonTransition(am,from,to,counter);
    am_local = (xmlAutomataPtr)to;
    if (to == (xmlAutomataStatePtr)0x0) {
      am_local = (xmlAutomataPtr)am->state;
    }
  }
  return (xmlAutomataStatePtr)am_local;
}

Assistant:

xmlAutomataStatePtr
xmlAutomataNewCountedTrans(xmlAutomataPtr am, xmlAutomataStatePtr from,
		xmlAutomataStatePtr to, int counter) {
    if ((am == NULL) || (from == NULL) || (counter < 0))
	return(NULL);
    xmlFAGenerateCountedEpsilonTransition(am, from, to, counter);
    if (to == NULL)
	return(am->state);
    return(to);
}